

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O2

Node * adios2::helper::anon_unknown_0::YAMLNode
                 (Node *__return_storage_ptr__,string *nodeName,Node *upperNode,string *hint,
                 bool isMandatory,value nodeType)

{
  bool bVar1;
  value vVar2;
  undefined7 in_register_00000081;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  YAML::Node::operator[]<std::__cxx11::string>(__return_storage_ptr__,upperNode,nodeName);
  if ((int)CONCAT71(in_register_00000081,isMandatory) != 0) {
    bVar1 = YAML::Node::operator!(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_48,"Helper",&local_e9);
      std::__cxx11::string::string((string *)&local_68,"adiosYAML",&local_ea);
      std::__cxx11::string::string((string *)&local_88,"YAMLNode",&local_eb);
      std::operator+(&local_e8,"no ",nodeName);
      std::operator+(&local_c8,&local_e8," node found, (is your node key lower case?), ");
      std::operator+(&local_a8,&local_c8,hint);
      Throw<std::invalid_argument>(&local_48,&local_68,&local_88,&local_a8,-1);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  bVar1 = YAML::Node::IsDefined(__return_storage_ptr__);
  if (bVar1) {
    vVar2 = YAML::Node::Type(__return_storage_ptr__);
    if (vVar2 != nodeType) {
      std::__cxx11::string::string((string *)&local_48,"Helper",&local_e9);
      std::__cxx11::string::string((string *)&local_68,"adiosYAML",&local_ea);
      std::__cxx11::string::string((string *)&local_88,"YAMLNode",&local_eb);
      std::operator+(&local_e8,"node ",nodeName);
      std::operator+(&local_c8,&local_e8,
                     " is the wrong type, review adios2 config YAML specs for the node, ");
      std::operator+(&local_a8,&local_c8,hint);
      Throw<std::invalid_argument>(&local_48,&local_68,&local_88,&local_a8,-1);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

YAML::Node YAMLNode(const std::string nodeName, const YAML::Node &upperNode,
                    const std::string &hint, const bool isMandatory,
                    const YAML::NodeType::value nodeType)
{
    const YAML::Node node = upperNode[nodeName];

    if (isMandatory && !node)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosYAML", "YAMLNode",
            "no " + nodeName + " node found, (is your node key lower case?), " + hint);
    }
    if (node && node.Type() != nodeType)
    {
        helper::Throw<std::invalid_argument>("Helper", "adiosYAML", "YAMLNode",
                                             "node " + nodeName +
                                                 " is the wrong type, review adios2 "
                                                 "config YAML specs for the node, " +
                                                 hint);
    }
    return node;
}